

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_casts.cpp
# Opt level: O1

BoundCastInfo *
duckdb::DefaultCasts::ListCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  LogicalTypeId LVar1;
  unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> uVar2;
  LogicalType *source_00;
  LogicalType *target_00;
  vector<duckdb::BoundCastInfo,_true> child_cast_info;
  undefined1 local_90 [32];
  BoundCastInfo local_70;
  pointer local_58;
  element_type *peStack_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  GetCastFunctionInput local_38;
  
  LVar1 = target->id_;
  if (LVar1 == VARCHAR) {
    LogicalType::LogicalType((LogicalType *)&local_70,VARCHAR);
    LogicalType::LIST((LogicalType *)&local_58,(LogicalType *)&local_70);
    ListBoundCastData::BindListToListCast
              ((ListBoundCastData *)local_90,input,source,(LogicalType *)&local_58);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,ListToVarcharCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)local_90,ListBoundCastData::InitListLocalState);
    if ((_func_int **)local_90._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_90._0_8_ + 8))();
    }
    local_90._0_8_ = (_func_int **)0x0;
    LogicalType::~LogicalType((LogicalType *)&local_58);
    LogicalType::~LogicalType((LogicalType *)&local_70);
  }
  else if (LVar1 == ARRAY) {
    local_58 = (pointer)0x0;
    peStack_50 = (element_type *)0x0;
    local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    source_00 = ListType::GetChildType(source);
    target_00 = ArrayType::GetChildType(target);
    local_38.context.ptr = (input->context).ptr;
    local_38.query_location.index = (input->query_location).index;
    CastFunctionSet::GetCastFunction(&local_70,input->function_set,source_00,target_00,&local_38);
    local_90._16_8_ = operator_new(0x20);
    uVar2.super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
    super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
    super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
         (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         local_70.cast_data;
    *(cast_function_t *)(local_90._16_8_ + 8) = local_70.function;
    *(init_cast_local_state_t *)(local_90._16_8_ + 0x10) = local_70.init_local_state;
    local_70.cast_data.
    super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
    super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
    super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
         (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
          )0x0;
    *(undefined ***)local_90._16_8_ = &PTR__ListBoundCastData_024937f8;
    ((_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_> *)
    (local_90._16_8_ + 0x18))->super__Head_base<0UL,_duckdb::BoundCastData_*,_false> =
         (_Head_base<0UL,_duckdb::BoundCastData_*,_false>)
         uVar2.super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
         .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
    ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::~vector
              ((vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_> *)&local_58);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,ListToArrayCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)(local_90 + 0x10),ListBoundCastData::InitListLocalState);
    if ((init_cast_local_state_t)local_90._16_8_ != (init_cast_local_state_t)0x0) {
      (**(code **)(*(long *)local_90._16_8_ + 8))();
    }
  }
  else if (LVar1 == LIST) {
    ListBoundCastData::BindListToListCast
              ((ListBoundCastData *)(local_90 + 0x18),input,source,target);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,ListCast::ListToListCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)(local_90 + 0x18),ListBoundCastData::InitListLocalState);
    if ((tuple<duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)local_90._24_8_
        != (_Head_base<0UL,_duckdb::BoundCastData_*,_false>)0x0) {
      (**(code **)(*(long *)local_90._24_8_ + 8))();
    }
  }
  else {
    local_90._8_8_ = (cast_function_t)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)(local_90 + 8),(init_cast_local_state_t)0x0);
    if ((cast_function_t)local_90._8_8_ != (cast_function_t)0x0) {
      (**(code **)(*(long *)local_90._8_8_ + 8))();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::ListCastSwitch(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	switch (target.id()) {
	case LogicalTypeId::LIST:
		return BoundCastInfo(ListCast::ListToListCast, ListBoundCastData::BindListToListCast(input, source, target),
		                     ListBoundCastData::InitListLocalState);
	case LogicalTypeId::VARCHAR:
		return BoundCastInfo(
		    ListToVarcharCast,
		    ListBoundCastData::BindListToListCast(input, source, LogicalType::LIST(LogicalType::VARCHAR)),
		    ListBoundCastData::InitListLocalState);
	case LogicalTypeId::ARRAY:
		return BoundCastInfo(ListToArrayCast, BindListToArrayCast(input, source, target),
		                     ListBoundCastData::InitListLocalState);
	default:
		return DefaultCasts::TryVectorNullCast;
	}
}